

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter.c
# Opt level: O1

void xml_reporter_start_test(TestReporter *reporter,char *testname)

{
  void *memo;
  CgreenBreadcrumb *breadcrumb;
  long lVar1;
  undefined8 uVar2;
  xmlChar *pxVar3;
  FILE *pFVar4;
  
  memo = reporter->memo;
  lVar1 = (long)context_stack_p;
  uVar2 = xmlNewChild((&child_output_tmpfile)[lVar1 * 5],0,"testcase",0);
  *(undefined8 *)(&DAT_00118f78 + lVar1 * 0x28) = uVar2;
  pxVar3 = xmlEscapePropValue(testname);
  xmlNewProp(*(undefined8 *)(&DAT_00118f78 + lVar1 * 0x28),"name",pxVar3);
  (*_xmlFree)(pxVar3);
  breadcrumb = reporter->breadcrumb;
  *(int *)((long)memo + 8) = breadcrumb->depth + -1;
  suite_path[0] = '\0';
  walk_breadcrumb(breadcrumb,print_path_segment_walker,memo);
  pxVar3 = xmlEscapePropValue(suite_path);
  xmlNewProp(*(undefined8 *)(&DAT_00118f78 + lVar1 * 0x28),"classname",pxVar3);
  (*_xmlFree)(pxVar3);
  reporter_start_test(reporter,testname);
  pFVar4 = tmpfile();
  child_output_tmpfile = (FILE *)pFVar4;
  uVar2 = xmlGetCharEncodingHandler(1);
  uVar2 = xmlOutputBufferCreateFile(pFVar4,uVar2);
  child_output_writer = (xmlTextWriterPtr)xmlNewTextWriter(uVar2);
  return;
}

Assistant:

static void xml_reporter_start_test(TestReporter *reporter, const char *testname) {
    XmlMemo *memo = (XmlMemo *)reporter->memo;
    FILE *out = file_stack[file_stack_p-1];

    memo->printer(out, indent(reporter));
    memo->printer(out, "<testcase classname=\"");
    memo->segment_count = reporter->breadcrumb->depth - 1;
    walk_breadcrumb(reporter->breadcrumb, print_path_segment_walker, memo);

    // Don't terminate the XML-node now so that we can add the duration later
    // But then we need to accumulate subsequent output to report later
    memo->printer(out, "\" name=\"%s\"", testname);
    reporter_start_test(reporter, testname);
    output = strdup("");

    child_output_tmpfile = tmpfile();
}